

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O2

void Amap_CreateRulesTwo(Amap_Lib_t *p,Vec_Int_t *vNods,Vec_Int_t *vNods0,Vec_Int_t *vNods1,int fXor
                        )

{
  int *piVar1;
  int iFan0;
  int iVar2;
  int Var;
  ulong uVar3;
  ulong uVar4;
  int i;
  int i_00;
  
  i_00 = 0;
  do {
    if (vNods0->nSize <= i_00) {
      return;
    }
    iFan0 = Vec_IntEntry(vNods0,i_00);
    for (i = 0; i < vNods1->nSize; i = i + 1) {
      iVar2 = Vec_IntEntry(vNods1,i);
      Var = Amap_LibFindNode(p,iFan0,iVar2,fXor);
      if (Var == -1) {
        Var = Amap_LibCreateNode(p,iFan0,iVar2,fXor);
      }
      iVar2 = Abc_Var2Lit(Var,0);
      uVar3 = (ulong)(uint)vNods->nSize;
      if (vNods->nSize < 1) {
        uVar3 = 0;
      }
      uVar4 = 0;
      do {
        if (uVar3 == uVar4) {
          Vec_IntPush(vNods,iVar2);
          break;
        }
        piVar1 = vNods->pArray + uVar4;
        uVar4 = uVar4 + 1;
      } while (*piVar1 != iVar2);
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Amap_CreateRulesTwo( Amap_Lib_t * p, Vec_Int_t * vNods, Vec_Int_t * vNods0, Vec_Int_t * vNods1, int fXor )
{
    int i, k, iNod, iNod0, iNod1;
    Vec_IntForEachEntry( vNods0, iNod0, i )
    Vec_IntForEachEntry( vNods1, iNod1, k )
    {
        iNod = Amap_LibFindNode( p, iNod0, iNod1, fXor );
        if ( iNod == -1 )
            iNod = Amap_LibCreateNode( p, iNod0, iNod1, fXor );
        Vec_IntPushUnique( vNods, Abc_Var2Lit(iNod, 0) );
    }
}